

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::
Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>_>_>
::~Own(Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>_>_>
       *this)

{
  AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>_>
  *pAVar1;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>_>
                 *)0x0) {
    this->ptr = (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>_>
                 *)0x0;
    (**this->disposer->_vptr_Disposer)
              (this->disposer,
               (pAVar1->super_AttachmentPromiseNodeBase).super_PromiseNode._vptr_PromiseNode[-2] +
               (long)&(pAVar1->super_AttachmentPromiseNodeBase).super_PromiseNode._vptr_PromiseNode)
    ;
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }